

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O2

istream * sc_dt::operator>>(istream *is,sc_string_old *s)

{
  int iVar1;
  undefined8 in_RAX;
  sc_string_rep *this;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  char c;
  
  this = s->rep;
  if (1 < this->ref_count) {
    this->ref_count = this->ref_count + -1;
    this = (sc_string_rep *)operator_new(0x10);
    sc_string_rep::sc_string_rep(this,0x10);
    s->rep = this;
  }
  pcVar3 = this->str;
  do {
    plVar2 = (long *)std::istream::get((char *)is);
    c = (char)((ulong)in_RAX >> 0x38);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    iVar1 = isspace((int)c);
  } while (iVar1 != 0);
  lVar4 = 0;
  while (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0) {
    iVar1 = isspace((int)c);
    if (iVar1 != 0) break;
    if ((long)s->rep->alloc + -2 < lVar4) {
      s->rep->str[lVar4] = '\0';
      sc_string_rep::resize(s->rep,(int)((double)s->rep->alloc * 1.5));
      pcVar3 = s->rep->str + lVar4;
    }
    *pcVar3 = c;
    pcVar3 = pcVar3 + 1;
    lVar4 = lVar4 + 1;
    std::istream::get((char *)is);
  }
  *pcVar3 = '\0';
  return is;
}

Assistant:

::std::istream&
operator >> ( ::std::istream& is, sc_string_old& s )
{
    if( s.rep->ref_count > 1 ) {
        -- s.rep->ref_count;
        s.rep = new sc_string_rep;
    }

    int i = 0;
    char* p = s.rep->str;
    char c;

    // skip white spaces
    while( is.get( c ) && isspace( c ) )
        ;

    for( ; is.good() && ! isspace( c ); is.get( c ) ) {
        if( i > s.rep->alloc - 2 ) {
	    s.rep->str[i] = '\0';
            s.rep->resize( (int) (s.rep->alloc * 1.5) );
            p = s.rep->str + i;
        }
        *p ++ = c;
        i ++;
    }
    *p = '\0';

    return is;
}